

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O3

void __thiscall
cppcms::impl::tcp_pipe::tcp_pipe
          (tcp_pipe *this,shared_ptr<cppcms::http::context> *connection,string *ip,int port)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  service *this_00;
  service *psVar3;
  
  (this->super_enable_shared_from_this<cppcms::impl::tcp_pipe>)._M_weak_this.
  super___weak_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<cppcms::impl::tcp_pipe>)._M_weak_this.
  super___weak_ptr<cppcms::impl::tcp_pipe,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->connection_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (connection->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (connection->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->connection_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->ip_)._M_dataplus._M_p = (pointer)&(this->ip_).field_2;
  pcVar2 = (ip->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ip_,pcVar2,pcVar2 + ip->_M_string_length);
  this->port_ = port;
  (this->data_)._M_dataplus._M_p = (pointer)&(this->data_).field_2;
  (this->data_)._M_string_length = 0;
  (this->data_).field_2._M_local_buf[0] = '\0';
  this_00 = http::context::service
                      ((this->connection_).
                       super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  psVar3 = cppcms::service::impl(this_00);
  booster::aio::stream_socket::stream_socket
            (&this->socket_,
             (psVar3->io_service_)._M_t.
             super___uniq_ptr_impl<booster::aio::io_service,_std::default_delete<booster::aio::io_service>_>
             ._M_t.
             super__Tuple_impl<0UL,_booster::aio::io_service_*,_std::default_delete<booster::aio::io_service>_>
             .super__Head_base<0UL,_booster::aio::io_service_*,_false>._M_head_impl);
  (this->input_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->input_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->input_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

tcp_pipe(booster::shared_ptr<http::context> connection,std::string const &ip,int port) :
				connection_(connection),
				ip_(ip),
				port_(port),
				socket_(connection_->service().impl().get_io_service())
			{
			}